

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

void __thiscall
wasm::GlobalTypeRewriter::mapTypeNamesAndIndices(GlobalTypeRewriter *this,TypeMap *oldToNewTypes)

{
  uint uVar1;
  __node_base_ptr this_00;
  bool bVar2;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *this_01;
  reference __in;
  type *__x;
  reference __in_00;
  type *this_02;
  pointer ppVar3;
  mapped_type *this_03;
  pointer ppVar4;
  mapped_type *pmVar5;
  string *in_R9;
  Name NVar6;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar7;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true> local_178;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true> local_170;
  iterator it_1;
  allocator<char> local_151;
  string local_150 [32];
  anon_class_8_1_339552ce local_130;
  function<bool_(wasm::Name)> local_128;
  Names *local_108;
  size_t sStack_100;
  undefined1 local_f8 [8];
  Name deduped;
  TypeNames *oldNames;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_d8;
  iterator it;
  type *new_;
  type *old;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_b8;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  TypeMap *__range1_1;
  type *info;
  type *type;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_68;
  iterator __end1;
  iterator __begin1;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *__range1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  typeNames;
  TypeMap *oldToNewTypes_local;
  GlobalTypeRewriter *this_local;
  
  typeNames._M_h._M_single_bucket = (__node_base_ptr)oldToNewTypes;
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&__range1);
  this_01 = &this->wasm->typeNames;
  __end1 = std::
           unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
           ::begin(this_01);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
       ::end(this_01);
  while (bVar2 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                            ,&local_68), this_00 = typeNames._M_h._M_single_bucket, bVar2) {
    __in = std::__detail::
           _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::operator*
                     (&__end1);
    std::get<0ul,wasm::HeapType_const,wasm::TypeNames>(__in);
    __x = std::get<1ul,wasm::HeapType_const,wasm::TypeNames>(__in);
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              *)&__range1,&__x->name);
    std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
    operator++(&__end1);
  }
  __end1_1 = std::
             unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
             ::begin((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                      *)typeNames._M_h._M_single_bucket);
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
       ::end((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
              *)this_00);
  while (bVar2 = std::__detail::operator!=
                           (&__end1_1.
                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                            ,&local_b8), bVar2) {
    __in_00 = std::__detail::
              _Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
              operator*(&__end1_1);
    this_02 = std::get<0ul,wasm::HeapType_const,wasm::HeapType>(__in_00);
    it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>._M_cur =
         (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)
         std::get<1ul,wasm::HeapType_const,wasm::HeapType>(__in_00);
    bVar2 = HeapType::operator==
                      (this_02,(HeapType *)
                               it.
                               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                               ._M_cur);
    if (!bVar2) {
      local_d8._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
           ::find(&this->wasm->typeNames,this_02);
      oldNames = (TypeNames *)
                 std::
                 unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                 ::end(&this->wasm->typeNames);
      bVar2 = std::__detail::operator!=
                        (&local_d8,
                         (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                          *)&oldNames);
      if (bVar2) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
                 operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>
                             *)&local_d8);
        deduped.super_IString.str._M_str = (char *)&ppVar3->second;
        this_03 = std::
                  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                  ::operator[](&this->wasm->typeNames,
                               (key_type *)
                               it.
                               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                               ._M_cur);
        TypeNames::operator=(this_03,&ppVar3->second);
        local_108 = *(Names **)deduped.super_IString.str._M_str;
        sStack_100 = *(size_t *)(deduped.super_IString.str._M_str + 8);
        local_130.typeNames =
             (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              *)&__range1;
        std::function<bool(wasm::Name)>::
        function<wasm::GlobalTypeRewriter::mapTypeNamesAndIndices(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::HeapType>>>const&)::__0,void>
                  ((function<bool(wasm::Name)> *)&local_128,&local_130);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_150,"_",&local_151);
        NVar6.super_IString.str._M_str = (char *)&local_128;
        NVar6.super_IString.str._M_len = sStack_100;
        NVar6 = Names::getValidName(local_108,NVar6,(function<bool_(wasm::Name)> *)0x0,
                                    (Index)local_150,in_R9);
        deduped.super_IString.str._M_len = NVar6.super_IString.str._M_str;
        local_f8 = NVar6.super_IString.str._M_len;
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator(&local_151);
        std::function<bool_(wasm::Name)>::~function(&local_128);
        wasm::Name::operator=((Name *)deduped.super_IString.str._M_str,(Name *)local_f8);
        pVar7 = std::
                unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                          *)&__range1,(value_type *)local_f8);
        it_1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur =
             (_Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>)
             pVar7.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
      }
      local_170._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
           ::find(&this->wasm->typeIndices,this_02);
      local_178._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
           ::end(&this->wasm->typeIndices);
      bVar2 = std::__detail::operator!=(&local_170,&local_178);
      if (bVar2) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>::
                 operator->((_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>
                             *)&local_170);
        uVar1 = ppVar4->second;
        pmVar5 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[](&this->wasm->typeIndices,
                              (key_type *)
                              it.
                              super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                              ._M_cur);
        *pmVar5 = uVar1;
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::operator++
              (&__end1_1);
  }
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&__range1);
  return;
}

Assistant:

void GlobalTypeRewriter::mapTypeNamesAndIndices(const TypeMap& oldToNewTypes) {
  // Update type names to avoid duplicates.
  std::unordered_set<Name> typeNames;
  for (auto& [type, info] : wasm.typeNames) {
    typeNames.insert(info.name);
  }
  for (auto& [old, new_] : oldToNewTypes) {
    if (old == new_) {
      // The type is being mapped to itself; no need to rename anything.
      continue;
    }

    if (auto it = wasm.typeNames.find(old); it != wasm.typeNames.end()) {
      auto& oldNames = it->second;
      wasm.typeNames[new_] = oldNames;
      // Use the existing name in the new type, as usually it completely
      // replaces the old. Rename the old name in a unique way to avoid
      // confusion in the case that it remains used.
      auto deduped = Names::getValidName(
        oldNames.name, [&](Name test) { return !typeNames.count(test); });
      oldNames.name = deduped;
      typeNames.insert(deduped);
    }
    if (auto it = wasm.typeIndices.find(old); it != wasm.typeIndices.end()) {
      // It's ok if we end up with duplicate indices. Ties will be resolved in
      // some arbitrary manner.
      wasm.typeIndices[new_] = it->second;
    }
  }
}